

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_jmpcc(DisasContext_conflict2 *s,int cond,TCGLabel *l1)

{
  undefined1 local_40 [8];
  DisasCompare_conflict c;
  TCGContext_conflict2 *tcg_ctx;
  TCGLabel *l1_local;
  int cond_local;
  DisasContext_conflict2 *s_local;
  
  c.v2 = (TCGv_i32)s->uc->tcg_ctx;
  gen_cc_cond((DisasCompare_conflict *)local_40,s,cond);
  update_cc_op(s);
  tcg_gen_brcond_i32_m68k((TCGContext_conflict2 *)c.v2,local_40._0_4_,(TCGv_i32)c._0_8_,c.v1,l1);
  free_cond((TCGContext_conflict2 *)c.v2,(DisasCompare_conflict *)local_40);
  return;
}

Assistant:

static void gen_jmpcc(DisasContext *s, int cond, TCGLabel *l1)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    DisasCompare c;

    gen_cc_cond(&c, s, cond);
    update_cc_op(s);
    tcg_gen_brcond_i32(tcg_ctx, c.tcond, c.v1, c.v2, l1);
    free_cond(tcg_ctx, &c);
}